

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

TermList __thiscall
Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>::denormalize
          (MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this)

{
  TermList TVar1;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffff28;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffff30;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  *x;
  AnyPoly *in_stack_ffffffffffffff40;
  AnyPoly *in_stack_ffffffffffffff48;
  PolyNf *in_stack_ffffffffffffff50;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffff68;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffff88;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffff90;
  Monom *in_stack_ffffffffffffffd8;
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffffe0;
  
  x = (Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
       *)&stack0xffffffffffffff50;
  MonomFactors(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  Lib::
  perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
            (in_stack_ffffffffffffff68);
  AnyPoly::AnyPoly<Kernel::NumTraits<Kernel::IntegerConstantType>>(in_stack_ffffffffffffff40,x);
  PolyNf::PolyNf(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  TVar1 = PolyNf::denormalize((PolyNf *)in_stack_ffffffffffffff68);
  Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~Polynom
            ((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x373035);
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::~Monom
            ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x37303f);
  ~MonomFactors((MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x373049);
  return (TermList)TVar1._content;
}

Assistant:

TermList MonomFactors<Number>::denormalize()  const
{
  return PolyNf(AnyPoly(perfect(Polynom(Monom(MonomFactors(*this)))))).denormalize(); 
}